

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

uint get_terminal_columns(void)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_34 [2];
  ushort local_32;
  winsize ts;
  int cols;
  long num;
  char *endptr;
  char *colp;
  uint width;
  
  colp._4_4_ = 0;
  endptr = (char *)curl_getenv();
  if (endptr != (char *)0x0) {
    register0x00000000 = strtol(endptr,(char **)&num,10);
    pcVar1 = endptr;
    if (((((char *)num != endptr) && (sVar3 = strlen(endptr), (char *)num == pcVar1 + sVar3)) &&
        (0x14 < stack0xffffffffffffffd8)) && (stack0xffffffffffffffd8 < 10000)) {
      colp._4_4_ = (uint)stack0xffffffffffffffd8;
    }
    curl_free();
  }
  if (colp._4_4_ == 0) {
    ts.ws_row = 0;
    ts.ws_col = 0;
    iVar2 = ioctl(0,0x5413,local_34);
    if (iVar2 == 0) {
      ts._0_4_ = ZEXT24(local_32);
    }
    if ((-1 < (int)ts._0_4_) && ((int)ts._0_4_ < 10000)) {
      colp._4_2_ = ts.ws_row;
      colp._6_2_ = ts.ws_col;
    }
  }
  if (colp._4_4_ == 0) {
    colp._4_4_ = 0x4f;
  }
  return colp._4_4_;
}

Assistant:

unsigned int get_terminal_columns(void)
{
  unsigned int width = 0;
  char *colp = curl_getenv("COLUMNS");
  if(colp) {
    char *endptr;
    long num = strtol(colp, &endptr, 10);
    if((endptr != colp) && (endptr == colp + strlen(colp)) && (num > 20) &&
       (num < 10000))
      width = (unsigned int)num;
    curl_free(colp);
  }

  if(!width) {
    int cols = 0;

#ifdef TIOCGSIZE
    struct ttysize ts;
    if(!ioctl(STDIN_FILENO, TIOCGSIZE, &ts))
      cols = ts.ts_cols;
#elif defined(TIOCGWINSZ)
    struct winsize ts;
    if(!ioctl(STDIN_FILENO, TIOCGWINSZ, &ts))
      cols = (int)ts.ws_col;
#elif defined(_WIN32) && !defined(CURL_WINDOWS_UWP)
    {
      HANDLE  stderr_hnd = GetStdHandle(STD_ERROR_HANDLE);
      CONSOLE_SCREEN_BUFFER_INFO console_info;

      if((stderr_hnd != INVALID_HANDLE_VALUE) &&
         GetConsoleScreenBufferInfo(stderr_hnd, &console_info)) {
        /*
         * Do not use +1 to get the true screen-width since writing a
         * character at the right edge will cause a line wrap.
         */
        cols = (int)
          (console_info.srWindow.Right - console_info.srWindow.Left);
      }
    }
#endif /* TIOCGSIZE */
    if(cols >= 0 && cols < 10000)
      width = (unsigned int)cols;
  }
  if(!width)
    width = 79;
  return width; /* 79 for unknown, might also be very small or very big */
}